

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

void __thiscall sf::WindowBase::initialize(WindowBase *this)

{
  long lVar1;
  long *in_RDI;
  bool visible;
  WindowBase *in_stack_fffffffffffffff0;
  
  visible = SUB81((ulong)in_RDI >> 0x38,0);
  setVisible(in_stack_fffffffffffffff0,visible);
  setMouseCursorVisible(in_stack_fffffffffffffff0,visible);
  setKeyRepeatEnabled(in_stack_fffffffffffffff0,visible);
  lVar1 = (**(code **)(*(long *)in_RDI[1] + 0x28))();
  in_RDI[2] = lVar1;
  (**(code **)(*in_RDI + 0x28))();
  return;
}

Assistant:

void WindowBase::initialize()
{
    // Setup default behaviors (to get a consistent behavior across different implementations)
    setVisible(true);
    setMouseCursorVisible(true);
    setKeyRepeatEnabled(true);

    // Get and cache the initial size of the window
    m_size = m_impl->getSize();

    // Notify the derived class
    onCreate();
}